

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprogressdialog.cpp
# Opt level: O1

void __thiscall QProgressDialogPrivate::ensureSizeIsAtLeastSizeHint(QProgressDialogPrivate *this)

{
  QWidget *this_00;
  QWidgetData *pQVar1;
  Representation RVar2;
  Representation RVar3;
  long in_FS_OFFSET;
  QSize size;
  QSize local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  local_18 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
  local_18 = (QSize)(**(code **)(*(long *)this_00 + 0x70))(this_00);
  pQVar1 = this_00->data;
  if ((pQVar1->widget_attributes & 0x8000) != 0) {
    RVar2.m_i = ((pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i) + 1;
    RVar3.m_i = ((pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i) + 1;
    if (RVar2.m_i < local_18.wd.m_i) {
      RVar2.m_i = local_18.wd.m_i;
    }
    if (RVar3.m_i < local_18.ht.m_i) {
      RVar3.m_i = local_18.ht.m_i;
    }
    local_18.ht.m_i = RVar3.m_i;
    local_18.wd.m_i = RVar2.m_i;
  }
  QWidget::resize(this_00,&local_18);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QProgressDialogPrivate::ensureSizeIsAtLeastSizeHint()
{
    Q_Q(QProgressDialog);

    QSize size = q->sizeHint();
    if (q->isVisible())
        size = size.expandedTo(q->size());
    q->resize(size);
}